

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O1

void __thiscall CaDiCaL::Internal::increase_elimination_bound(Internal *this)

{
  int64_t *piVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  pointer pFVar5;
  long lVar6;
  long lVar7;
  int idx;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  lVar4 = (this->lim).elimbound;
  lVar6 = (long)(this->opts).elimboundmax;
  if (lVar4 < lVar6) {
    lVar7 = 1;
    if (lVar4 != 0) {
      lVar7 = lVar4 * 2;
    }
    lVar10 = 0;
    if (-1 < lVar4) {
      lVar10 = lVar7;
    }
    if (lVar6 <= lVar10) {
      lVar10 = lVar6;
    }
    (this->lim).elimbound = lVar10;
    if (this->internal != (Internal *)0x0) {
      phase(this->internal,"elim-phase",(this->stats).elimphases,"new elimination bound %ld",
            (this->lim).elimbound);
    }
    iVar3 = *(this->vars).n;
    if (iVar3 != 0) {
      uVar9 = 1;
      do {
        iVar8 = (int)uVar9;
        uVar11 = (ulong)(uint)-iVar8;
        if (0 < iVar8) {
          uVar11 = uVar9;
        }
        pFVar5 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((uint)pFVar5[uVar11] & 0x7000100) == 0x1000000) {
          piVar1 = &(this->stats).mark.elim;
          *piVar1 = *piVar1 + 1;
          puVar2 = &pFVar5[uVar11].field_0x1;
          *puVar2 = *puVar2 | 1;
        }
        uVar9 = (ulong)(iVar8 + 1);
      } while (iVar8 != iVar3);
    }
    report(this,'^',0);
    return;
  }
  return;
}

Assistant:

void Internal::increase_elimination_bound () {

  if (lim.elimbound >= opts.elimboundmax)
    return;

  if (lim.elimbound < 0)
    lim.elimbound = 0;
  else if (!lim.elimbound)
    lim.elimbound = 1;
  else
    lim.elimbound *= 2;

  if (lim.elimbound > opts.elimboundmax)
    lim.elimbound = opts.elimboundmax;

  PHASE ("elim-phase", stats.elimphases,
         "new elimination bound %" PRId64 "", lim.elimbound);

  // Now reschedule all active variables for elimination again.
  //
#ifdef LOGGING
  int count = 0;
#endif
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (flags (idx).elim)
      continue;
    mark_elim (idx);
#ifdef LOGGING
    count++;
#endif
  }
  LOG ("marked %d variables as elimination candidates", count);

  report ('^');
}